

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::assign<float>
          (CImg<unsigned_char> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  float fVar1;
  uchar *puVar2;
  CImg<unsigned_char> *pCVar3;
  uchar *puVar4;
  
  if ((values != (float *)0x0) &&
     ((ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x != 0)) {
    assign(this,size_x,size_y,size_z,size_c);
    puVar2 = this->_data;
    puVar4 = puVar2 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    for (; puVar2 < puVar4; puVar2 = puVar2 + 1) {
      fVar1 = *values;
      values = values + 1;
      *puVar2 = (uchar)(int)fVar1;
    }
    return this;
  }
  pCVar3 = assign(this);
  return pCVar3;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      assign(size_x,size_y,size_z,size_c);
      const t *ptrs = values; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      return *this;
    }